

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_23::OptionsToInterpret::OptionsToInterpret
          (OptionsToInterpret *this,string_view ns,string_view el,Span<const_int> path,
          Message *orig_opt,Message *opt)

{
  allocator_type local_39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->name_scope).field_2;
  (this->name_scope)._M_dataplus._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,ns._M_str,ns._M_str + ns._M_len);
  (this->element_name)._M_dataplus._M_p = (pointer)&(this->element_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->element_name,el._M_str,el._M_str + el._M_len);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&this->element_path,(int *)orig_opt,
             (int *)((long)&(orig_opt->super_MessageLite)._vptr_MessageLite + (long)path.ptr_ * 4),
             &local_39);
  this->original_options = (Message *)path.len_;
  this->options = opt;
  return;
}

Assistant:

OptionsToInterpret(absl::string_view ns, absl::string_view el,
                     absl::Span<const int> path, const Message* orig_opt,
                     Message* opt)
      : name_scope(ns),
        element_name(el),
        element_path(path.begin(), path.end()),
        original_options(orig_opt),
        options(opt) {}